

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

HelpColumns * __thiscall
Catch::Clara::Opt::getHelpColumns(HelpColumns *__return_storage_ptr__,Opt *this)

{
  ostream *poVar1;
  pointer pSVar2;
  size_type sVar3;
  bool bVar4;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar5;
  size_t sVar6;
  StringRef *opt;
  pointer pSVar7;
  ReusableStringStream oss;
  char local_41;
  ReusableStringStream local_40;
  
  pSVar5 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar6 = StringStreams::add(&pSVar5->super_StringStreams);
  local_40.m_index = sVar6;
  pSVar5 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  poVar1 = (ostream *)
           (pSVar5->super_StringStreams).m_streams.
           super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar6].m_ptr;
  pSVar7 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->m_optNames).
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_40.m_oss = poVar1;
  if (pSVar7 != pSVar2) {
    bVar4 = true;
    do {
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      }
      std::ostream::write((char *)poVar1,(long)pSVar7->m_start);
      pSVar7 = pSVar7 + 1;
      bVar4 = false;
    } while (pSVar7 != pSVar2);
  }
  if ((this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint.m_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," <",2);
    std::ostream::write((char *)poVar1,
                        (long)(this->super_ParserRefImpl<Catch::Clara::Opt>).m_hint.m_start);
    local_41 = '>';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_41,1);
  }
  std::__cxx11::stringbuf::str();
  sVar3 = (this->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_size;
  (__return_storage_ptr__->descriptions).m_start =
       (this->super_ParserRefImpl<Catch::Clara::Opt>).m_description.m_start;
  (__return_storage_ptr__->descriptions).m_size = sVar3;
  ReusableStringStream::~ReusableStringStream(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Detail::HelpColumns Opt::getHelpColumns() const {
            ReusableStringStream oss;
            bool first = true;
            for (auto const& opt : m_optNames) {
                if (first)
                    first = false;
                else
                    oss << ", ";
                oss << opt;
            }
            if (!m_hint.empty())
                oss << " <" << m_hint << '>';
            return { oss.str(), m_description };
        }